

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableNextRow(ImGuiTableRowFlags row_flags,float row_min_height)

{
  ImGuiTable *table_00;
  float fVar1;
  ImGuiTable *table;
  ImGuiContext *g;
  float row_min_height_local;
  ImGuiTableRowFlags row_flags_local;
  
  table_00 = GImGui->CurrentTable;
  if ((table_00->IsLayoutLocked & 1U) == 0) {
    TableUpdateLayout(table_00);
  }
  if ((table_00->IsInsideRow & 1U) != 0) {
    TableEndRow(table_00);
  }
  *(uint *)&table_00->field_0x98 =
       *(uint *)&table_00->field_0x98 & 0xffff |
       (int)(short)*(undefined4 *)&table_00->field_0x98 << 0x10;
  *(uint *)&table_00->field_0x98 = *(uint *)&table_00->field_0x98 & 0xffff0000 | row_flags & 0xffffU
  ;
  table_00->RowMinHeight = row_min_height;
  TableBeginRow(table_00);
  table_00->RowPosY2 = table_00->CellPaddingY + table_00->CellPaddingY + table_00->RowPosY2;
  fVar1 = ImMax<float>(table_00->RowPosY2,table_00->RowPosY1 + row_min_height);
  table_00->RowPosY2 = fVar1;
  table_00->InnerWindow->SkipItems = true;
  return;
}

Assistant:

void ImGui::TableNextRow(ImGuiTableRowFlags row_flags, float row_min_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;

    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);
    if (table->IsInsideRow)
        TableEndRow(table);

    table->LastRowFlags = table->RowFlags;
    table->RowFlags = row_flags;
    table->RowMinHeight = row_min_height;
    TableBeginRow(table);

    // We honor min_row_height requested by user, but cannot guarantee per-row maximum height,
    // because that would essentially require a unique clipping rectangle per-cell.
    table->RowPosY2 += table->CellPaddingY * 2.0f;
    table->RowPosY2 = ImMax(table->RowPosY2, table->RowPosY1 + row_min_height);

    // Disable output until user calls TableNextColumn()
    table->InnerWindow->SkipItems = true;
}